

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_sasl_challenge(SASL_CHALLENGE_HANDLE sasl_challenge)

{
  AMQP_VALUE pAVar1;
  
  if (sasl_challenge != (SASL_CHALLENGE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(sasl_challenge->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_challenge(SASL_CHALLENGE_HANDLE sasl_challenge)
{
    AMQP_VALUE result;

    if (sasl_challenge == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)sasl_challenge;
        result = amqpvalue_clone(sasl_challenge_instance->composite_value);
    }

    return result;
}